

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_sync.hpp
# Opt level: O2

void __thiscall unodb::detail::thread_sync::notify(thread_sync *this)

{
  std::mutex::lock(&this->sync_mutex);
  this->flag = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->sync_mutex);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void notify() {
    {
      const std::lock_guard lock{sync_mutex};
      flag = true;
    }
    sync.notify_one();
  }